

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::StorageCompatibilityVersionSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  ::std::__cxx11::string::string
            ((string *)&local_30,(string *)&(pDVar1->options).serialization_compatibility);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value StorageCompatibilityVersionSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);

	auto &version_name = config.options.serialization_compatibility.duckdb_version;
	return Value(version_name);
}